

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void text_sequence_args(t_text_sequence *x,t_symbol *s,int argc,t_atom *argv)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  t_atom *ptVar4;
  long lVar5;
  
  ptVar4 = (t_atom *)resizebytes(x->x_argv,(long)x->x_argc << 4,(long)argc << 4);
  x->x_argv = ptVar4;
  if (0 < argc) {
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&argv->a_type + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&x->x_argv->a_type + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)argc << 4 != lVar5);
  }
  x->x_argc = argc;
  return;
}

Assistant:

static void text_sequence_args(t_text_sequence *x, t_symbol *s,
    int argc, t_atom *argv)
{
    int i;
    x->x_argv = t_resizebytes(x->x_argv,
        x->x_argc * sizeof(t_atom), argc * sizeof(t_atom));
    for (i = 0; i < argc; i++)
        x->x_argv[i] = argv[i];
    x->x_argc = argc;
}